

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_pigpiod_if2.c
# Opt level: O0

void t5(int pi)

{
  int iVar1;
  size_t sVar2;
  int in_EDI;
  undefined4 uVar3;
  char text [2048];
  int id;
  int wid;
  int c;
  int oc;
  int e;
  gpioPulse_t wf [4];
  char *TEXT;
  int BAUD;
  undefined4 in_stack_fffffffffffff778;
  undefined4 in_stack_fffffffffffff77c;
  undefined8 in_stack_fffffffffffff780;
  char *pcVar4;
  int pc;
  int in_stack_fffffffffffff788;
  int in_stack_fffffffffffff78c;
  int in_stack_fffffffffffff790;
  int iVar5;
  int in_stack_fffffffffffff794;
  int t;
  char local_868 [2060];
  undefined4 local_5c;
  undefined4 local_58;
  int local_54;
  int local_50;
  int local_4c;
  undefined1 local_48 [56];
  char *local_10;
  int local_8;
  int local_4;
  
  iVar5 = (int)((ulong)in_stack_fffffffffffff780 >> 0x20);
  local_8 = 0x12c0;
  local_10 = 
  "\nNow is the winter of our discontent\nMade glorious summer by this sun of York;\nAnd all the clouds that lour\'d upon our house\nIn the deep bosom of the ocean buried.\nNow are our brows bound with victorious wreaths;\nOur bruised arms hung up for monuments;\nOur stern alarums changed to merry meetings,\nOur dreadful marches to delightful measures.\nGrim-visaged war hath smooth\'d his wrinkled front;\nAnd now, instead of mounting barded steeds\nTo fright the souls of fearful adversaries,\nHe capers nimbly in a lady\'s chamber\nTo the lascivious pleasing of a lute.\n"
  ;
  local_4 = in_EDI;
  memcpy(local_48,&DAT_00107b30,0x30);
  printf("Waveforms & serial read/write tests.\n");
  local_5c = callback(local_4,0x19,1,t5cbf);
  set_mode(local_4,0x19,1);
  local_4c = wave_clear(local_4);
  CHECK(in_stack_fffffffffffff794,in_stack_fffffffffffff790,in_stack_fffffffffffff78c,
        in_stack_fffffffffffff788,iVar5,
        (char *)CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778));
  local_4c = wave_add_generic(local_4,4,local_48);
  CHECK(in_stack_fffffffffffff794,in_stack_fffffffffffff790,in_stack_fffffffffffff78c,
        in_stack_fffffffffffff788,iVar5,
        (char *)CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778));
  local_58 = wave_create(local_4);
  local_4c = wave_send_repeat(local_4,local_58);
  if (local_4c < 0xe) {
    CHECK(in_stack_fffffffffffff794,in_stack_fffffffffffff790,in_stack_fffffffffffff78c,
          in_stack_fffffffffffff788,iVar5,
          (char *)CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778));
  }
  else {
    CHECK(in_stack_fffffffffffff794,in_stack_fffffffffffff790,in_stack_fffffffffffff78c,
          in_stack_fffffffffffff788,iVar5,
          (char *)CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778));
  }
  local_50 = t5_count;
  time_sleep(0x4014333333333333);
  local_54 = t5_count - local_50;
  CHECK(in_stack_fffffffffffff794,in_stack_fffffffffffff790,in_stack_fffffffffffff78c,
        in_stack_fffffffffffff788,iVar5,
        (char *)CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778));
  local_4c = wave_tx_stop(local_4);
  CHECK(in_stack_fffffffffffff794,in_stack_fffffffffffff790,in_stack_fffffffffffff78c,
        in_stack_fffffffffffff788,iVar5,
        (char *)CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778));
  local_4c = bb_serial_read_open(local_4,0x19,local_8,8);
  CHECK(in_stack_fffffffffffff794,in_stack_fffffffffffff790,in_stack_fffffffffffff78c,
        in_stack_fffffffffffff788,iVar5,
        (char *)CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778));
  wave_clear(local_4);
  iVar5 = local_4;
  t = local_8;
  sVar2 = strlen(local_10);
  uVar3 = (undefined4)sVar2;
  pcVar4 = local_10;
  local_4c = wave_add_serial(iVar5,0x19,t,8,2,5000000);
  CHECK(t,iVar5,in_stack_fffffffffffff78c,in_stack_fffffffffffff788,(int)((ulong)pcVar4 >> 0x20),
        (char *)CONCAT44(in_stack_fffffffffffff77c,uVar3));
  local_58 = wave_create(local_4);
  local_4c = wave_send_once(local_4,local_58);
  iVar1 = (int)((ulong)pcVar4 >> 0x20);
  if (local_4c < 0x1b34) {
    CHECK(t,iVar5,in_stack_fffffffffffff78c,in_stack_fffffffffffff788,iVar1,
          (char *)CONCAT44(in_stack_fffffffffffff77c,uVar3));
  }
  else {
    CHECK(t,iVar5,in_stack_fffffffffffff78c,in_stack_fffffffffffff788,iVar1,
          (char *)CONCAT44(in_stack_fffffffffffff77c,uVar3));
  }
  local_50 = t5_count;
  time_sleep(0x4008000000000000);
  local_54 = t5_count - local_50;
  CHECK(t,iVar5,in_stack_fffffffffffff78c,in_stack_fffffffffffff788,(int)((ulong)pcVar4 >> 0x20),
        (char *)CONCAT44(in_stack_fffffffffffff77c,uVar3));
  local_50 = t5_count;
  while( true ) {
    iVar1 = wave_tx_busy(local_4);
    pc = (int)((ulong)pcVar4 >> 0x20);
    if (iVar1 == 0) break;
    time_sleep(0x3fb999999999999a);
  }
  time_sleep(0x3fb999999999999a);
  local_54 = t5_count - local_50;
  CHECK(t,iVar5,in_stack_fffffffffffff78c,in_stack_fffffffffffff788,pc,
        (char *)CONCAT44(in_stack_fffffffffffff77c,uVar3));
  local_54 = bb_serial_read(local_4,0x19,local_868,0x7ff);
  if (0 < local_54) {
    local_868[local_54] = '\0';
  }
  strcmp(local_10,local_868);
  CHECK(t,iVar5,in_stack_fffffffffffff78c,in_stack_fffffffffffff788,pc,
        (char *)CONCAT44(in_stack_fffffffffffff77c,uVar3));
  local_4c = bb_serial_read_close(local_4,0x19);
  CHECK(t,iVar5,in_stack_fffffffffffff78c,in_stack_fffffffffffff788,pc,
        (char *)CONCAT44(in_stack_fffffffffffff77c,uVar3));
  local_54 = wave_get_micros(local_4);
  CHECK(t,iVar5,in_stack_fffffffffffff78c,in_stack_fffffffffffff788,pc,
        (char *)CONCAT44(in_stack_fffffffffffff77c,uVar3));
  local_54 = wave_get_high_micros(local_4);
  if (0x5df744 < local_54) {
    local_54 = 0x5df744;
  }
  CHECK(t,iVar5,in_stack_fffffffffffff78c,in_stack_fffffffffffff788,pc,
        (char *)CONCAT44(in_stack_fffffffffffff77c,uVar3));
  local_54 = wave_get_max_micros(local_4);
  CHECK(t,iVar5,in_stack_fffffffffffff78c,in_stack_fffffffffffff788,pc,
        (char *)CONCAT44(in_stack_fffffffffffff77c,uVar3));
  local_54 = wave_get_pulses(local_4);
  CHECK(t,iVar5,in_stack_fffffffffffff78c,in_stack_fffffffffffff788,pc,
        (char *)CONCAT44(in_stack_fffffffffffff77c,uVar3));
  local_54 = wave_get_high_pulses(local_4);
  CHECK(t,iVar5,in_stack_fffffffffffff78c,in_stack_fffffffffffff788,pc,
        (char *)CONCAT44(in_stack_fffffffffffff77c,uVar3));
  local_54 = wave_get_max_pulses(local_4);
  CHECK(t,iVar5,in_stack_fffffffffffff78c,in_stack_fffffffffffff788,pc,
        (char *)CONCAT44(in_stack_fffffffffffff77c,uVar3));
  local_54 = wave_get_cbs(local_4);
  if (local_54 < 0x1b33) {
    CHECK(t,iVar5,in_stack_fffffffffffff78c,in_stack_fffffffffffff788,pc,
          (char *)CONCAT44(in_stack_fffffffffffff77c,uVar3));
  }
  else {
    CHECK(t,iVar5,in_stack_fffffffffffff78c,in_stack_fffffffffffff788,pc,
          (char *)CONCAT44(in_stack_fffffffffffff77c,uVar3));
  }
  local_54 = wave_get_high_cbs(local_4);
  if (local_54 < 0x1b33) {
    CHECK(t,iVar5,in_stack_fffffffffffff78c,in_stack_fffffffffffff788,pc,
          (char *)CONCAT44(in_stack_fffffffffffff77c,uVar3));
  }
  else {
    CHECK(t,iVar5,in_stack_fffffffffffff78c,in_stack_fffffffffffff788,pc,
          (char *)CONCAT44(in_stack_fffffffffffff77c,uVar3));
  }
  local_54 = wave_get_max_cbs(local_4);
  CHECK(t,iVar5,in_stack_fffffffffffff78c,in_stack_fffffffffffff788,pc,
        (char *)CONCAT44(in_stack_fffffffffffff77c,uVar3));
  callback_cancel(local_5c);
  return;
}

Assistant:

void t5(int pi)
{
   int BAUD=4800;

   char *TEXT=
"\n\
Now is the winter of our discontent\n\
Made glorious summer by this sun of York;\n\
And all the clouds that lour'd upon our house\n\
In the deep bosom of the ocean buried.\n\
Now are our brows bound with victorious wreaths;\n\
Our bruised arms hung up for monuments;\n\
Our stern alarums changed to merry meetings,\n\
Our dreadful marches to delightful measures.\n\
Grim-visaged war hath smooth'd his wrinkled front;\n\
And now, instead of mounting barded steeds\n\
To fright the souls of fearful adversaries,\n\
He capers nimbly in a lady's chamber\n\
To the lascivious pleasing of a lute.\n\
";

   gpioPulse_t wf[] =
   {
      {1<<GPIO, 0,  10000},
      {0, 1<<GPIO,  30000},
      {1<<GPIO, 0,  60000},
      {0, 1<<GPIO, 100000},
   };

   int e, oc, c, wid, id;

   char text[2048];

   printf("Waveforms & serial read/write tests.\n");

   id = callback(pi, GPIO, FALLING_EDGE, t5cbf);

   set_mode(pi, GPIO, PI_OUTPUT);

   e = wave_clear(pi);
   CHECK(5, 1, e, 0, 0, "callback, set mode, wave clear");

   e = wave_add_generic(pi, 4, wf);
   CHECK(5, 2, e, 4, 0, "pulse, wave add generic");

   wid = wave_create(pi);
   e = wave_send_repeat(pi, wid);
   if (e < 14) CHECK(5, 3, e,  9, 0, "wave tx repeat");
   else        CHECK(5, 3, e, 19, 0, "wave tx repeat");

   oc = t5_count;
   time_sleep(5.05);
   c = t5_count - oc;
   CHECK(5, 4, c, 50, 2, "callback");

   e = wave_tx_stop(pi);
   CHECK(5, 5, e, 0, 0, "wave tx stop");

   e = bb_serial_read_open(pi, GPIO, BAUD, 8);
   CHECK(5, 6, e, 0, 0, "serial read open");

   wave_clear(pi);
   e = wave_add_serial(pi, GPIO, BAUD, 8, 2, 5000000, strlen(TEXT), TEXT);
   CHECK(5, 7, e, 3405, 0, "wave clear, wave add serial");

   wid = wave_create(pi);
   e = wave_send_once(pi, wid);
   if (e < 6964) CHECK(5, 8, e, 6811, 0, "wave tx start");
   else          CHECK(5, 8, e, 7116, 0, "wave tx start");

   oc = t5_count;
   time_sleep(3);
   c = t5_count - oc;
   CHECK(5, 9, c, 0, 0, "callback");

   oc = t5_count;
   while (wave_tx_busy(pi)) time_sleep(0.1);
   time_sleep(0.1);
   c = t5_count - oc;
   CHECK(5, 10, c, 1702, 0, "wave tx busy, callback");

   c = bb_serial_read(pi, GPIO, text, sizeof(text)-1);
   if (c > 0) text[c] = 0; /* null terminate string */
   CHECK(5, 11, strcmp(TEXT, text), 0, 0, "wave tx busy, serial read");

   e = bb_serial_read_close(pi, GPIO);
   CHECK(5, 12, e, 0, 0, "serial read close");

   c = wave_get_micros(pi);
   CHECK(5, 13, c, 6158148, 0, "wave get micros");

   c = wave_get_high_micros(pi);
   if (c > 6158148) c = 6158148;
   CHECK(5, 14, c, 6158148, 0, "wave get high micros");

   c = wave_get_max_micros(pi);
   CHECK(5, 15, c, 1800000000, 0, "wave get max micros");

   c = wave_get_pulses(pi);
   CHECK(5, 16, c, 3405, 0, "wave get pulses");

   c = wave_get_high_pulses(pi);
   CHECK(5, 17, c, 3405, 0, "wave get high pulses");

   c = wave_get_max_pulses(pi);
   CHECK(5, 18, c, 12000, 0, "wave get max pulses");

   c = wave_get_cbs(pi);
   if (c < 6963) CHECK(5, 19, c, 6810, 0, "wave get cbs");
   else          CHECK(5, 19, c, 7115, 0, "wave get cbs");

   c = wave_get_high_cbs(pi);
   if (c < 6963) CHECK(5, 20, c, 6810, 0, "wave get high cbs");
   else          CHECK(5, 20, c, 7115, 0, "wave get high cbs");

   c = wave_get_max_cbs(pi);
   CHECK(5, 21, c, 25016, 0, "wave get max cbs");

   callback_cancel(id);
}